

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O0

int ecx_waitinframe(ecx_portt *port,int idx,int timeout)

{
  osal_timert local_24;
  osal_timert timer;
  int wkc;
  int timeout_local;
  int idx_local;
  ecx_portt *port_local;
  
  timer.stop_time.usec = timeout;
  osal_timer_start(&local_24,timeout);
  timer.stop_time.sec = ecx_waitinframe_red(port,idx,&local_24);
  if (0x7fffffff < timer.stop_time.sec) {
    ecx_setbufstat(port,idx,0);
  }
  return timer.stop_time.sec;
}

Assistant:

int ecx_waitinframe(ecx_portt *port, int idx, int timeout)
{
   int wkc;
   osal_timert timer;
   
   osal_timer_start (&timer, timeout); 
   wkc = ecx_waitinframe_red(port, idx, &timer);
   /* if nothing received, clear buffer index status so it can be used again */
   if (wkc <= EC_NOFRAME) 
   {
      ecx_setbufstat(port, idx, EC_BUF_EMPTY);
   }
   
   return wkc;
}